

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_spec.cpp
# Opt level: O0

void __thiscall FParser::EvaluateFunction(FParser *this,svalue_t *result,int start,int stop)

{
  int start_00;
  long *plVar1;
  svalue_t *local_cc0;
  code *local_cb8;
  svalue_t *local_c50;
  undefined1 local_c38 [8];
  svalue_t argv [128];
  int local_30;
  int argc;
  int endpoint;
  int startpoint;
  DFsVariable *func;
  int stop_local;
  int start_local;
  svalue_t *result_local;
  FParser *this_local;
  
  _endpoint = (DFsVariable *)0x0;
  local_c50 = (svalue_t *)local_c38;
  do {
    svalue_t::svalue_t(local_c50);
    local_c50 = local_c50 + 1;
  } while (local_c50 != (svalue_t *)&argv[0x7f].value);
  if (((this->TokenType[start] == function) && (this->TokenType[stop] == operator_)) &&
     (*this->Tokens[stop] == ')')) {
    _endpoint = DFsScript::VariableForName(global_script,this->Tokens[start]);
    if (_endpoint == (DFsVariable *)0x0) {
      script_error("no such function: \'%s\'\n",this->Tokens[start]);
    }
    else if ((_endpoint->type != 3) && (_endpoint->type != 9)) {
      script_error("\'%s\' not a function\n",this->Tokens[start]);
    }
  }
  else {
    script_error("misplaced closing paren\n");
  }
  argv[0x7f].value._4_4_ = 0;
  for (local_30 = start + 2; start_00 = local_30, local_30 < stop; local_30 = local_30 + 1) {
    local_30 = FindOperator(this,local_30,stop + -1,",");
    if (local_30 == -1) {
      local_30 = stop;
    }
    if (local_30 + -1 < start_00) break;
    EvaluateExpression(this,(svalue_t *)&argv[(long)(int)argv[0x7f].value._4_4_ + -1].value,start_00
                       ,local_30 + -1);
    argv[0x7f].value._4_4_ = argv[0x7f].value._4_4_ + 1;
  }
  this->t_argc = argv[0x7f].value._4_4_;
  this->t_argv = (svalue_t *)local_c38;
  (this->t_return).type = 1;
  (this->t_return).value.i = 0;
  if (_endpoint->type == 3) {
    local_cb8 = (code *)(_endpoint->value).handler;
    plVar1 = (long *)((long)this->Tokens + *(long *)((long)&_endpoint->value + 8) + -0x10);
    if (((ulong)local_cb8 & 1) != 0) {
      local_cb8 = *(code **)(local_cb8 + *plVar1 + -1);
    }
    (*local_cb8)(plVar1);
  }
  else {
    RunLineSpecial(this,(_endpoint->value).ls);
  }
  svalue_t::operator=(result,&this->t_return);
  local_cc0 = (svalue_t *)&argv[0x7f].value;
  do {
    local_cc0 = local_cc0 + -1;
    svalue_t::~svalue_t(local_cc0);
  } while (local_cc0 != (svalue_t *)local_c38);
  return;
}

Assistant:

void FParser::EvaluateFunction(svalue_t &result, int start, int stop)
{
	DFsVariable *func = NULL;
	int startpoint, endpoint;
	
	// the arguments need to be built locally in case of
	// function returns as function arguments eg
	// print("here is a random number: ", rnd() );
	
	int argc;
	svalue_t argv[MAXARGS];
	
	if(TokenType[start] != function || TokenType[stop] != operator_
		|| Tokens[stop][0] != ')' )
	{
		script_error("misplaced closing paren\n");
	}
	
	// all the functions are stored in the global script
	else if( !(func = global_script->VariableForName (Tokens[start]))  )
	{
		script_error("no such function: '%s'\n",Tokens[start]);
	}
	
	else if(func->type != svt_function && func->type != svt_linespec)
	{
		script_error("'%s' not a function\n", Tokens[start]);
	}
	
	// build the argument list
	// use a C command-line style system rather than
	// a system using a fixed length list
	
	argc = 0;
	endpoint = start + 2;   // ignore the function name and first bracket
	
	while(endpoint < stop)
    {
		startpoint = endpoint;
		endpoint = FindOperator(startpoint, stop-1, ",");
		
		// check for -1: no more ','s 
		if(endpoint == -1)
		{               // evaluate the last expression
			endpoint = stop;
		}
		if(endpoint-1 < startpoint)
			break;
		
		EvaluateExpression(argv[argc], startpoint, endpoint-1);
		endpoint++;    // skip the ','
		argc++;
    }
	
	// store the arguments in the global arglist
	t_argc = argc;
	t_argv = argv;
	
	// haleyjd: return values can propagate to void functions, so
	// t_return needs to be cleared now
	
	t_return.type = svt_int;
	t_return.value.i = 0;
	
	// now run the function
	if (func->type == svt_function)
	{
		(this->*func->value.handler)();
	}
	else
	{
		RunLineSpecial(func->value.ls);
	}
	
	// return the returned value
	result = t_return;
}